

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.hpp
# Opt level: O2

void __thiscall AssignmentNode::~AssignmentNode(AssignmentNode *this)

{
  ~AssignmentNode(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

AssignmentNode(const std::string& name, 
    const AssignmentOperator& operation, std::unique_ptr<ExpressionNode> value):
      name_(name), operator_(operation), value_(std::move(value)) {}